

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

const_iterator * __thiscall
plot::
Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
::cend(const_iterator *__return_storage_ptr__,
      Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
      *this)

{
  size_t overflow;
  iterator local_868;
  iterator local_658;
  margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  local_448;
  Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *local_18;
  Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  *this_local;
  
  overflow = this->bottom_;
  local_18 = this;
  this_local = (Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                *)__return_storage_ptr__;
  detail::
  normal_block_ref_traits<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_true>
  ::end(&local_658,&this->block_);
  detail::
  normal_block_ref_traits<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_true>
  ::end(&local_868,&this->block_);
  detail::
  margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  ::margin_line(&local_448,this,overflow,&local_658,&local_868);
  detail::
  block_iterator<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  ::block_iterator(__return_storage_ptr__,&local_448);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cend() const {
        return { { this, std::ptrdiff_t(bottom_), detail::block_traits<Block>::end(block_), detail::block_traits<Block>::end(block_) } };
    }